

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O0

Class objc_upgrade_class(objc_class_gsv1 *oldClass)

{
  BOOL BVar1;
  Class aClass;
  objc_ivar_list *poVar2;
  objc_method_list *poVar3;
  objc_property_list *poVar4;
  Class poVar5;
  Class cls;
  objc_class_gsv1 *oldClass_local;
  
  aClass = (Class)calloc(0x88,1);
  aClass->isa = oldClass->isa;
  aClass->name = oldClass->name;
  aClass->version = oldClass->version;
  aClass->info = 1;
  aClass->instance_size = oldClass->instance_size;
  poVar2 = upgradeIvarList(oldClass);
  aClass->ivars = poVar2;
  poVar3 = upgradeMethodList(oldClass->methods);
  aClass->methods = poVar3;
  aClass->protocols = oldClass->protocols;
  aClass->abi_version = oldClass->abi_version;
  poVar4 = upgradePropertyList(oldClass->properties);
  aClass->properties = poVar4;
  objc_register_selectors_from_class(aClass);
  BVar1 = objc_test_class_flag_gsv1(oldClass,objc_class_flag_meta_gsv1);
  if (BVar1 == '\0') {
    aClass->info = 0;
    poVar5 = objc_upgrade_class((objc_class_gsv1 *)aClass->isa);
    aClass->isa = poVar5;
    objc_setAssociatedObject((id_conflict)aClass,&legacy_key,(id_conflict)oldClass,0);
  }
  else {
    aClass->instance_size = 0x88;
  }
  return aClass;
}

Assistant:

PRIVATE Class objc_upgrade_class(struct objc_class_gsv1 *oldClass)
{
	Class cls = calloc(sizeof(struct objc_class), 1);
	cls->isa = oldClass->isa;
	// super_class is left nil and we upgrade it later.
	cls->name = oldClass->name;
	cls->version = oldClass->version;
	cls->info = objc_class_flag_meta;
	cls->instance_size = oldClass->instance_size;
	cls->ivars = upgradeIvarList(oldClass);
	cls->methods = upgradeMethodList(oldClass->methods);
	cls->protocols = oldClass->protocols;
	cls->abi_version = oldClass->abi_version;
	cls->properties = upgradePropertyList(oldClass->properties);
	objc_register_selectors_from_class(cls);
	if (!objc_test_class_flag_gsv1(oldClass, objc_class_flag_meta_gsv1))
	{
		cls->info = 0;
		cls->isa = objc_upgrade_class((struct objc_class_gsv1*)cls->isa);
		objc_setAssociatedObject((id)cls, &legacy_key, (id)oldClass, OBJC_ASSOCIATION_ASSIGN);
	}
	else
	{
		cls->instance_size = sizeof(struct objc_class);
	}
	return cls;
}